

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O2

Aig_Man_t * Saig_ManRetimeForwardOne(Aig_Man_t *p,int *pnRegFixed,int *pnRegMoves)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *vCut;
  void **ppvVar3;
  Aig_Man_t *pAVar4;
  int iVar5;
  void *Entry;
  
  Saig_ManMarkAutonomous(p);
  Aig_ManIncrementTravId(p);
  *pnRegFixed = 0;
  for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar5);
    if (*(int *)((long)pvVar2 + 0x20) == p->nTravIds + -1) {
      *(int *)((long)pvVar2 + 0x20) = p->nTravIds;
    }
    else {
      *pnRegFixed = *pnRegFixed + 1;
    }
  }
  *pnRegMoves = 0;
  for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,iVar5);
    if ((((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) &&
        (iVar1 = *(int *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x20),
        iVar1 == p->nTravIds)) &&
       (*(int *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x20) == iVar1)) {
      *(int *)((long)pvVar2 + 0x20) = iVar1;
      *pnRegMoves = *pnRegMoves + 1;
    }
  }
  for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar5);
    *(int *)((long)pvVar2 + 0x20) = p->nTravIds;
  }
  vCut = (Vec_Ptr_t *)malloc(0x10);
  vCut->nCap = 1000;
  vCut->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  vCut->pArray = ppvVar3;
  Aig_ManIncrementTravId(p);
  for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,iVar5);
    if (pvVar2 != (void *)0x0) {
      iVar1 = p->nTravIds;
      if (*(int *)((long)pvVar2 + 0x20) != iVar1 + -1) {
        Entry = (void *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe);
        if ((Entry != (void *)0x0) && (*(int *)((long)Entry + 0x20) == iVar1 + -1)) {
          Vec_PtrPush(vCut,Entry);
          iVar1 = p->nTravIds;
          *(int *)((long)Entry + 0x20) = iVar1;
        }
        pvVar2 = (void *)(*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe);
        if ((pvVar2 != (void *)0x0) && (*(int *)((long)pvVar2 + 0x20) == iVar1 + -1)) {
          Vec_PtrPush(vCut,pvVar2);
          *(int *)((long)pvVar2 + 0x20) = p->nTravIds;
        }
      }
    }
  }
  pAVar4 = Saig_ManRetimeDupForward(p,vCut);
  free(vCut->pArray);
  free(vCut);
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_ManRetimeForwardOne( Aig_Man_t * p, int * pnRegFixed, int * pnRegMoves )
{
    Aig_Man_t * pNew;
    Vec_Ptr_t * vCut;
    Aig_Obj_t * pObj, * pFanin;
    int i;
    // mark the retimable nodes
    Saig_ManMarkAutonomous( p );
    // mark the retimable registers with the fresh trav ID
    Aig_ManIncrementTravId( p );
    *pnRegFixed = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( Aig_ObjIsTravIdPrevious(p, pObj) )
            Aig_ObjSetTravIdCurrent(p, pObj);
        else
            (*pnRegFixed)++;
    // mark all the nodes that can be retimed forward
    *pnRegMoves = 0;
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(p, Aig_ObjFanin0(pObj)) && Aig_ObjIsTravIdCurrent(p, Aig_ObjFanin1(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, pObj);
            (*pnRegMoves)++;
        }
    // mark the remaining registers
    Saig_ManForEachLo( p, pObj, i )
        Aig_ObjSetTravIdCurrent(p, pObj);
    // find the cut (all such marked objects that fanout into unmarked nodes)
    vCut = Vec_PtrAlloc( 1000 );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsTravIdPrevious(p, pObj) )
            continue;
        pFanin = Aig_ObjFanin0(pObj);
        if ( pFanin && Aig_ObjIsTravIdPrevious(p, pFanin) )
        {
            Vec_PtrPush( vCut, pFanin );
            Aig_ObjSetTravIdCurrent( p, pFanin );
        }
        pFanin = Aig_ObjFanin1(pObj);
        if ( pFanin && Aig_ObjIsTravIdPrevious(p, pFanin) )
        {
            Vec_PtrPush( vCut, pFanin );
            Aig_ObjSetTravIdCurrent( p, pFanin );
        }
    }
    // finally derive the new manager
    pNew = Saig_ManRetimeDupForward( p, vCut );
    Vec_PtrFree( vCut );
    return pNew;
}